

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
poplar::
compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::get_parent_and_symb
          (compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint64_t node_id)

{
  bool bVar1;
  uint64_t uVar2;
  unsigned_long *__y;
  unsigned_long *__x;
  ulong in_RSI;
  compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  uint64_t key;
  uint64_t init_id;
  uint64_t dist;
  uint64_t in_stack_ffffffffffffff88;
  compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff90;
  compact_bonsai_trie<80U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffa0;
  int local_24;
  ulong local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = in_RSI;
  bVar1 = compare_dsp_(in_RDI,in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98);
  if (bVar1) {
    local_24 = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_true>(&local_10,&nil_id,&local_24);
  }
  else {
    uVar2 = get_dsp_(in_stack_ffffffffffffff98,(uint64_t)in_stack_ffffffffffffff90);
    if (local_20 < uVar2 - 1) {
      compact_vector::size(&in_RDI->table_);
    }
    __y = (unsigned_long *)get_quo_(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    size_p2::bits(&in_RDI->capa_size_);
    __x = (unsigned_long *)
          bijective_hash::split_mix_hasher::hash_inv
                    (&in_stack_ffffffffffffff90->hasher_,(uint64_t)__y);
    size_p2::bits(&in_RDI->symb_size_);
    size_p2::mask(&in_RDI->symb_size_);
    local_10 = std::make_pair<unsigned_long,unsigned_long>(__x,__y);
  }
  return local_10;
}

Assistant:

std::pair<uint64_t, uint64_t> get_parent_and_symb(uint64_t node_id) const {
        assert(node_id < capa_size_.size());

        if (compare_dsp_(node_id, 0)) {
            // root or not exist
            return {nil_id, 0};
        }

        uint64_t dist = get_dsp_(node_id) - 1;
        uint64_t init_id = dist <= node_id ? node_id - dist : table_.size() - (dist - node_id);
        uint64_t key = hasher_.hash_inv(get_quo_(node_id) << capa_size_.bits() | init_id);

        // Returns pair (parent, label)
        return std::make_pair(key >> symb_size_.bits(), key & symb_size_.mask());
    }